

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

Integer pnga_sprs_array_get_column(Integer s_a,Integer icol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long g_a;
  Integer IVar5;
  Integer IVar6;
  void *__ptr;
  undefined8 *__ptr_00;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_RSI;
  long in_RDI;
  Integer ihi_3;
  Integer ilo_3;
  char *pt_1;
  char *vt_1;
  Integer idx_1;
  Integer ihi_2;
  Integer ilo_2;
  void *vptr_1;
  int64_t *jptr_1;
  int64_t *iptr_1;
  char *pt;
  char *vt;
  Integer idx;
  Integer ihi_1;
  Integer ilo_1;
  void *vptr;
  int *jptr;
  int *iptr;
  Integer ihi;
  Integer ilo;
  char cplus [2];
  void *ptr;
  Integer iblock;
  Integer ld;
  Integer lo;
  Integer hi;
  Integer n;
  Integer j;
  Integer i;
  Integer *map;
  Integer *size;
  Integer me;
  Integer nprocs;
  Integer idim;
  Integer one;
  Integer type;
  int local_sync_end;
  int local_sync_begin;
  Integer handle;
  Integer g_v;
  Integer *in_stack_000002a0;
  void *in_stack_000002a8;
  Integer *in_stack_000002b0;
  Integer *in_stack_000002b8;
  Integer in_stack_000002c0;
  Integer in_stack_00000420;
  Integer in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  Integer in_stack_fffffffffffffec8;
  Integer *in_stack_fffffffffffffed0;
  Integer in_stack_fffffffffffffed8;
  Integer *in_stack_fffffffffffffee0;
  Integer *in_stack_fffffffffffffee8;
  Integer in_stack_fffffffffffffef0;
  long local_108;
  long local_100;
  void *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  long in_stack_ffffffffffffff48;
  long in_stack_ffffffffffffff50;
  long local_a0;
  long local_78;
  long local_70;
  long local_68;
  
  g_a = in_RDI + 1000;
  IVar5 = pnga_pgroup_nnodes(SPA[g_a].grp);
  IVar6 = pnga_pgroup_nodeid(SPA[g_a].grp);
  iVar4 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffec0);
  }
  lVar2 = SPA[g_a].ihi;
  lVar9 = SPA[g_a].ilo;
  __ptr = malloc(IVar5 << 3);
  __ptr_00 = (undefined8 *)malloc(IVar5 << 3);
  for (local_68 = 0; local_68 < IVar5; local_68 = local_68 + 1) {
    *(undefined8 *)((long)__ptr + local_68 * 8) = 0;
  }
  *(long *)((long)__ptr + IVar6 * 8) = (lVar2 - lVar9) + 1;
  pnga_pgroup_gop((Integer)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                  in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  *__ptr_00 = 1;
  for (local_68 = 1; local_68 < IVar5; local_68 = local_68 + 1) {
    __ptr_00[local_68] = __ptr_00[local_68 + -1] + *(long *)((long)__ptr + (local_68 + -1) * 8);
  }
  pnga_mask_sync((long)iVar1,(long)iVar4);
  IVar6 = pnga_create_handle();
  pnga_set_data((Integer)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pnga_set_pgroup((Integer)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  pnga_set_irreg_distr
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  pnga_mask_sync((long)iVar1,(long)iVar4);
  pnga_allocate(in_stack_00000420);
  pnga_mask_sync((long)iVar1,(long)iVar4);
  pnga_zero(g_a);
  if (lVar2 < lVar9) {
    local_a0 = 0;
  }
  else {
    in_stack_ffffffffffffff50 = lVar9 + 1;
    in_stack_ffffffffffffff48 = lVar2 + 1;
    pnga_access_ptr(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
                    in_stack_000002a0);
  }
  lVar3 = SPA[g_a].jdim;
  for (local_78 = 0; local_78 < SPA[g_a].nblocks; local_78 = local_78 + 1) {
    if (SPA[g_a].blkidx[local_78] == (in_RSI * IVar5) / lVar3) {
      local_68 = lVar9;
      if (SPA[g_a].idx_size == 4) {
        pnga_sprs_array_access_col_block
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        for (; local_68 <= lVar2; local_68 = local_68 + 1) {
          lVar7 = local_68 - lVar9;
          iVar1 = *(int *)((long)in_stack_ffffffffffffff40 + lVar7 * 4 + 4);
          for (local_70 = (long)*(int *)((long)in_stack_ffffffffffffff40 + lVar7 * 4);
              local_70 < iVar1; local_70 = local_70 + 1) {
            if (*(int *)((long)in_stack_ffffffffffffff38 + local_70 * 4) == in_RSI) {
              memcpy((void *)(local_a0 + lVar7 * SPA[g_a].size),
                     (void *)((long)in_stack_ffffffffffffff30 + local_70 * SPA[g_a].size),
                     SPA[g_a].size);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        for (; local_68 <= lVar2; local_68 = local_68 + 1) {
          lVar8 = local_68 - lVar9;
          lVar7 = *(long *)(local_100 + 8 + lVar8 * 8);
          for (local_70 = *(long *)(local_100 + lVar8 * 8); local_70 < lVar7;
              local_70 = local_70 + 1) {
            if (*(long *)(local_108 + local_70 * 8) == in_RSI) {
              memcpy((void *)(local_a0 + lVar8 * SPA[g_a].size),
                     (void *)(in_stack_fffffffffffffef0 + local_70 * SPA[g_a].size),SPA[g_a].size);
            }
          }
        }
      }
    }
  }
  lVar9 = lVar9 + 1;
  pnga_release(IVar6,(Integer *)&stack0xfffffffffffffec0,(Integer *)&stack0xfffffffffffffeb8);
  free(__ptr_00);
  free(__ptr);
  if (iVar4 != 0) {
    pnga_pgroup_sync(lVar9);
  }
  return IVar6;
}

Assistant:

Integer pnga_sprs_array_get_column(Integer s_a, Integer icol)
{
  Integer g_v;
  Integer handle = s_a + GA_OFFSET;
  int local_sync_begin,local_sync_end;
  Integer type = SPA[handle].type;
  Integer one = 1;
  Integer idim = SPA[handle].idim;
  Integer nprocs = pnga_pgroup_nnodes(SPA[handle].grp);
  Integer me = pnga_pgroup_nodeid(SPA[handle].grp);
  Integer *size, *map;
  Integer i, j, n, hi, lo, ld;
  Integer iblock;
  void *ptr;
  char cplus[2];
  cplus[0] = '+';
  cplus[1] = '\0';

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[handle].grp);

  /* Create map array containing row offsets */
  hi = SPA[handle].ihi;
  lo = SPA[handle].ilo;
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = hi - lo + 1;
  if (sizeof(Integer) == sizeof(int)) {
    pnga_pgroup_gop(SPA[handle].grp,C_INT,size,nprocs,cplus);
  } else {
    pnga_pgroup_gop(SPA[handle].grp,C_LONG,size,nprocs,cplus);
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) map[i] = map[i-1]+size[i-1];

  /* create column vector array and set it to zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_v = pnga_create_handle();
  pnga_set_data(g_v,one,&idim,type);
  pnga_set_pgroup(g_v,SPA[handle].grp);
  pnga_set_irreg_distr(g_v,map,&nprocs);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_allocate(g_v);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  if (hi >= lo) {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_access_ptr(g_v,&ilo,&ihi,&ptr,&ld);
  } else {
    ptr = NULL;
  }
  /* Find column block that contains value icol. Scan through all non-zero
   * in this block and if j-index corresponds to icol, then set corresponding
   * value in g_v
   */
  iblock = (icol*nprocs)/SPA[handle].jdim;
  for (n=0; n<SPA[handle].nblocks; n++) {
    if (SPA[handle].blkidx[n] == iblock) {
      if (SPA[handle].idx_size == sizeof(int)) {
        int *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      } else {
        int64_t *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      }
    }
  }
  {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_release(g_v,&ilo,&ihi);
  }
  free(map);
  free(size);
  if (local_sync_end) pnga_pgroup_sync(SPA[handle].grp);
  return g_v;
}